

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

int __thiscall
vera::TriangulatorData::AddTriangle
          (TriangulatorData *this,int a,int b,int c,int ab,int bc,int ca,int e)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  int t;
  int bc_local;
  int ab_local;
  int c_local;
  int b_local;
  int a_local;
  
  bc_local = bc;
  ab_local = ab;
  c_local = c;
  b_local = b;
  a_local = a;
  if (e < 0) {
    pvVar1 = &this->triangles;
    iVar3 = (int)((ulong)((long)(this->triangles).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->triangles).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&a_local);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&b_local);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&c_local);
    pvVar1 = &this->halfedges;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&ab_local);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&bc_local);
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&ca);
    t = 0;
    std::
    vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
    ::emplace_back<int>(&this->candidates,&t);
    t = 0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&this->errors,(float *)&t);
    t = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->queueIndexes,&t);
  }
  else {
    uVar4 = (ulong)(uint)e;
    piVar2 = (this->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[uVar4] = a;
    piVar2[uVar4 + 1] = b;
    piVar2[uVar4 + 2] = c;
    piVar2 = (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[uVar4] = ab;
    piVar2[uVar4 + 1] = bc;
    piVar2[uVar4 + 2] = ca;
    iVar3 = e;
  }
  if (-1 < ab_local) {
    (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[(uint)ab_local] = iVar3;
  }
  if (-1 < (long)bc_local) {
    (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[bc_local] = iVar3 + 1;
  }
  if (-1 < (long)ca) {
    (this->halfedges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[ca] = iVar3 + 2;
  }
  t = iVar3 / 3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->pending,&t);
  return iVar3;
}

Assistant:

int AddTriangle(const int a, const int b, const int c,
                    const int ab, const int bc, const int ca,
                    int e) {
        if (e < 0) {
            // new halfedge index
            e = triangles.size();
            // add triangle vertices
            triangles.push_back(a);
            triangles.push_back(b);
            triangles.push_back(c);
            // add triangle halfedges
            halfedges.push_back(ab);
            halfedges.push_back(bc);
            halfedges.push_back(ca);
            // add triangle metadata
            candidates.emplace_back(0);
            errors.push_back(0);
            queueIndexes.push_back(-1);
        } 
        else {
            // set triangle vertices
            triangles[e + 0] = a;
            triangles[e + 1] = b;
            triangles[e + 2] = c;
            // set triangle halfedges
            halfedges[e + 0] = ab;
            halfedges[e + 1] = bc;
            halfedges[e + 2] = ca;
        }

        // link neighboring halfedges
        if (ab >= 0)
            halfedges[ab] = e + 0;
        if (bc >= 0)
            halfedges[bc] = e + 1;
        if (ca >= 0)
            halfedges[ca] = e + 2;

        // add triangle to pending queue for later rasterization
        const int t = e / 3;
        pending.push_back(t);

        // return first halfedge index
        return e;
    }